

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::
TestinitiatorFixtureInvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException::
TestinitiatorFixtureInvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException
          (TestinitiatorFixtureInvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException
           *this)

{
  char *suiteName;
  TestinitiatorFixtureInvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException
  *this_local;
  
  suiteName = SuiteSessionTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,
             "InvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException",suiteName
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x9fe);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &
       PTR__TestinitiatorFixtureInvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException_0045b770
  ;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, InvalidRawFixMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException) {

  FIX42::NewOrderSingle newOrderSingle;
  std::string newOrderSingleRawFIX;
  std::string delimSOH = "\x01";
  newOrderSingleRawFIX = "8=FIX.4.2" + delimSOH
  + "35=A" + delimSOH
  + "9=114" + delimSOH
  + "34=2" + delimSOH
  + "49=ISLD" + delimSOH
  + "56=TW" + delimSOH
  + "52=20190517-16:08:43" + delimSOH
  + "98=0" + delimSOH
  + "108=1" + delimSOH
  + "10=166" + delimSOH;

  CHECK_THROW(object->next(newOrderSingleRawFIX, UtcTimeStamp()), InvalidMessage);

}